

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O1

bool __thiscall Uic::printDependencies(Uic *this)

{
  Option *pOVar1;
  DomIncludes *pDVar2;
  QArrayData *pQVar3;
  DomInclude **ppDVar4;
  long lVar5;
  QArrayData *pQVar6;
  longlong lVar7;
  long lVar8;
  DomCustomWidgets *pDVar9;
  DomCustomWidget **ppDVar10;
  FILE *pFVar11;
  char cVar12;
  DomUI *this_00;
  undefined8 *puVar13;
  long lVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QXmlStreamReader reader;
  QArrayData *local_80;
  undefined8 *local_78;
  QString local_68;
  char16_t *pcStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pOVar1 = this->opt;
  local_68.d.size = (qsizetype)(pOVar1->inputFile).d.d;
  pcStack_50 = (pOVar1->inputFile).d.ptr;
  local_48 = (pOVar1->inputFile).d.size;
  if ((QArrayData *)local_68.d.size != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_68.d.size)->ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((QArrayData *)local_68.d.size)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_68);
  if (local_48 == 0) {
    bVar15 = false;
    cVar12 = QFile::open(&local_68,_stdin,1,0);
    if (cVar12 == '\0') goto LAB_00176b28;
  }
  else {
    QFile::setFileName(&local_68);
    cVar12 = QFile::open(&local_68,1);
    if (cVar12 == '\0') {
      bVar15 = false;
      goto LAB_00176b28;
    }
  }
  local_80 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&local_80);
  QXmlStreamReader::setDevice((QIODevice *)&local_80);
  this_00 = parseUiFile((QXmlStreamReader *)&local_80);
  QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_80);
  bVar15 = this_00 != (DomUI *)0x0;
  if (bVar15) {
    pDVar2 = this_00->m_includes;
    if (pDVar2 != (DomIncludes *)0x0) {
      pQVar3 = &((pDVar2->m_include).d.d)->super_QArrayData;
      ppDVar4 = (pDVar2->m_include).d.ptr;
      lVar5 = (pDVar2->m_include).d.size;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (lVar5 != 0) {
        lVar14 = 0;
        do {
          puVar13 = *(undefined8 **)((long)ppDVar4 + lVar14);
          pQVar6 = (QArrayData *)*puVar13;
          lVar7 = puVar13[1];
          lVar8 = puVar13[2];
          if (pQVar6 != (QArrayData *)0x0) {
            LOCK();
            (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pFVar11 = _stdout;
          if (lVar8 != 0) {
            QString::toLocal8Bit_helper((QChar *)&local_80,lVar7);
            puVar13 = local_78;
            if (local_78 == (undefined8 *)0x0) {
              puVar13 = &QByteArray::_empty;
            }
            fprintf(pFVar11,"%s\n",puVar13);
            if (local_80 != (QArrayData *)0x0) {
              LOCK();
              (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_80,1,0x10);
              }
            }
          }
          if (pQVar6 != (QArrayData *)0x0) {
            LOCK();
            (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar6,2,0x10);
            }
          }
          lVar14 = lVar14 + 8;
        } while (lVar5 << 3 != lVar14);
      }
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,8,0x10);
        }
      }
    }
    pDVar9 = this_00->m_customWidgets;
    if (pDVar9 != (DomCustomWidgets *)0x0) {
      pQVar3 = &((pDVar9->m_customWidget).d.d)->super_QArrayData;
      ppDVar10 = (pDVar9->m_customWidget).d.ptr;
      lVar5 = (pDVar9->m_customWidget).d.size;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (lVar5 != 0) {
        lVar14 = 0;
        do {
          puVar13 = *(undefined8 **)(*(long *)((long)ppDVar10 + lVar14) + 0x38);
          if (puVar13 != (undefined8 *)0x0) {
            pQVar6 = (QArrayData *)*puVar13;
            lVar7 = puVar13[1];
            lVar8 = puVar13[2];
            if (pQVar6 != (QArrayData *)0x0) {
              LOCK();
              (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pFVar11 = _stdout;
            if (lVar8 != 0) {
              QString::toLocal8Bit_helper((QChar *)&local_80,lVar7);
              puVar13 = local_78;
              if (local_78 == (undefined8 *)0x0) {
                puVar13 = &QByteArray::_empty;
              }
              fprintf(pFVar11,"%s\n",puVar13);
              if (local_80 != (QArrayData *)0x0) {
                LOCK();
                (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_80,1,0x10);
                }
              }
            }
            if (pQVar6 != (QArrayData *)0x0) {
              LOCK();
              (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar6,2,0x10);
              }
            }
          }
          lVar14 = lVar14 + 8;
        } while (lVar5 << 3 != lVar14);
      }
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,8,0x10);
        }
      }
    }
    DomUI::~DomUI(this_00);
    operator_delete(this_00,0x148);
    bVar15 = true;
  }
LAB_00176b28:
  QFile::~QFile((QFile *)&local_68);
  if ((QArrayData *)local_68.d.size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68.d.size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68.d.size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68.d.size)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68.d.size,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar15;
  }
  __stack_chk_fail();
}

Assistant:

bool Uic::printDependencies()
{
    QString fileName = opt.inputFile;

    QFile f;
    if (fileName.isEmpty()) {
        if (!f.open(stdin, QIODevice::ReadOnly))
            return false;
    } else {
        f.setFileName(fileName);
        if (!f.open(QIODevice::ReadOnly))
            return false;
    }

    DomUI *ui = nullptr;
    {
        QXmlStreamReader reader;
        reader.setDevice(&f);
        ui = parseUiFile(reader);
        if (!ui)
            return false;
    }

    if (DomIncludes *includes = ui->elementIncludes()) {
        const auto incls = includes->elementInclude();
        for (DomInclude *incl : incls) {
            QString file = incl->text();
            if (file.isEmpty())
                continue;

            fprintf(stdout, "%s\n", file.toLocal8Bit().constData());
        }
    }

    if (DomCustomWidgets *customWidgets = ui->elementCustomWidgets()) {
        const auto elementCustomWidget = customWidgets->elementCustomWidget();
        for (DomCustomWidget *customWidget : elementCustomWidget) {
            if (DomHeader *header = customWidget->elementHeader()) {
                QString file = header->text();
                if (file.isEmpty())
                    continue;

                fprintf(stdout, "%s\n", file.toLocal8Bit().constData());
            }
        }
    }

    delete ui;

    return true;
}